

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocating_handler.hpp
# Opt level: O0

executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>
* __thiscall
libtorrent::aux::
handler_allocator<boost::asio::detail::executor_op<libtorrent::aux::allocating_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>,_72UL,_(libtorrent::aux::HandlerName)4>
::allocate(handler_allocator<boost::asio::detail::executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>,_72UL,_(libtorrent::aux::HandlerName)4>
           *this,size_t size)

{
  executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>
  *peVar1;
  size_t size_local;
  handler_allocator<boost::asio::detail::executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>,_72UL,_(libtorrent::aux::HandlerName)4>
  *this_local;
  
  peVar1 = (executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>
            *)::std::array<unsigned_char,_72UL>::data(&this->m_storage->bytes);
  return peVar1;
}

Assistant:

T* allocate(std::size_t size)
		{
			TORRENT_UNUSED(size);
			TORRENT_ASSERT_VAL(size == 1, size);
			TORRENT_ASSERT_VAL(sizeof(T) <= Size, sizeof(T));
			TORRENT_ASSERT(!m_storage->used);
#if TORRENT_USE_ASSERTS
			m_storage->used = true;
#endif
#ifdef TORRENT_ASIO_DEBUGGING
			record_handler_allocation<T>(static_cast<int>(Name), Size);
#endif
			return reinterpret_cast<T*>(m_storage->bytes.data());
		}